

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost12sum.c
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  FILE *pFVar4;
  char *pcVar5;
  char *pcVar6;
  int hashsize;
  uint uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  uint local_1288;
  int expected_hash_size;
  FILE *local_1280;
  undefined8 local_1278;
  char *local_1270;
  char sum_2 [129];
  gost2012_hash_ctx ctx;
  char calcsum [129];
  char local_1039;
  char sum [129];
  
  local_1278 = 0;
  bVar1 = true;
  local_1280 = (FILE *)((ulong)local_1280 & 0xffffffff00000000);
  iVar3 = 0x20;
  pFVar4 = (FILE *)0x0;
LAB_00101310:
  while( true ) {
    do {
      hashsize = iVar3;
      iVar2 = getopt(argc,argv,"hxlvc::");
      iVar3 = 0x40;
    } while (iVar2 == 0x6c);
    if (iVar2 != 99) break;
    iVar3 = hashsize;
    pFVar4 = _stdin;
    if ((_optarg != (char *)0x0) &&
       (pFVar4 = fopen(_optarg,"r"), pcVar5 = _optarg, pFVar4 == (FILE *)0x0)) {
LAB_0010171b:
      perror(pcVar5);
      iVar3 = 2;
LAB_00101722:
      exit(iVar3);
    }
  }
  if (iVar2 == 0x76) {
    bVar1 = false;
    local_1278 = 1;
    iVar3 = hashsize;
    goto LAB_00101310;
  }
  if (iVar2 == 0x78) {
    local_1280 = (FILE *)CONCAT44(local_1280._4_4_,1);
    iVar3 = hashsize;
    goto LAB_00101310;
  }
  if (iVar2 == -1) {
LAB_00101395:
    if (pFVar4 == (FILE *)0x0) {
      if ((int)local_1280 == 0) {
        lVar9 = (long)_optind;
        if (_optind != argc) {
          local_1288 = 0;
          for (; lVar9 < argc; lVar9 = lVar9 + 1) {
            iVar3 = hash_file(&ctx,argv[lVar9],sum,0,hashsize);
            if (iVar3 == 0) {
              local_1288 = local_1288 + 1;
            }
            else {
              printf("%s %s\n",sum,argv[lVar9]);
            }
          }
          goto LAB_001016eb;
        }
        iVar3 = fileno(_stdin);
        iVar3 = hash_stream(&ctx,iVar3,sum,hashsize);
        if (iVar3 != 0) {
          printf("%s -\n",sum);
          exit(0);
        }
        perror("stdin");
        iVar3 = 1;
        goto LAB_00101722;
      }
      local_1288 = 0;
      while ((iVar3 = feof(_stdin), iVar3 == 0 &&
             (pcVar5 = fgets(sum,0x1000,_stdin), pcVar5 != (char *)0x0))) {
        pcVar5 = &local_1039;
        do {
          pcVar6 = pcVar5;
          pcVar5 = pcVar6 + 1;
        } while (pcVar6[1] != '\0');
        for (; (*pcVar6 == '\r' || (*pcVar6 == '\n')); pcVar6 = pcVar6 + -1) {
          *pcVar6 = '\0';
        }
        iVar3 = hash_file(&ctx,sum,sum_2,0,hashsize);
        if (iVar3 == 0) {
          local_1288 = local_1288 + 1;
        }
        else {
          printf("%s %s\n",sum_2,sum);
        }
      }
      goto LAB_001016eb;
    }
  }
  else {
    if (iVar2 == 0x68) {
      help();
      goto LAB_00101395;
    }
    fprintf(_stderr,"invalid option %c\n",(ulong)_optopt);
    help();
  }
  expected_hash_size = 0;
  if (((pFVar4 == _stdin) && (_optind < argc)) &&
     (pFVar4 = fopen(argv[_optind],"r"), pFVar4 == (FILE *)0x0)) {
    pcVar5 = argv[_optind];
    goto LAB_0010171b;
  }
  local_1270 = "%s\tFAILED\n";
  if (bVar1) {
    local_1270 = "%s: GOST hash sum check failed\n";
  }
  local_1288 = 0;
  uVar7 = 0;
  uVar8 = 0;
  local_1280 = pFVar4;
  while (iVar3 = get_line((FILE *)local_1280,sum_2,sum,(int)local_1278,&expected_hash_size),
        iVar3 != 0) {
    lVar9 = (long)expected_hash_size;
    uVar10 = uVar8 + 1;
    if (lVar9 == 0) {
      fprintf(_stderr,"%s: invalid hash length\n",sum);
    }
    else {
      iVar3 = hash_file(&ctx,sum,calcsum,0,expected_hash_size);
      if (iVar3 != 0) {
        iVar3 = strncmp(calcsum,sum_2,lVar9 * 2 + 1);
        uVar10 = uVar8;
        if (iVar3 == 0) {
          if (!bVar1) {
            fprintf(_stderr,"%s\tOK\n",sum);
          }
        }
        else {
          fprintf(_stderr,local_1270,sum);
          local_1288 = local_1288 + 1;
        }
      }
    }
    uVar7 = uVar7 + 1;
    uVar8 = uVar10;
  }
  if (uVar8 != 0) {
    fprintf(_stderr,"%s: WARNING %d of %d file(s) cannot be processed\n",*argv,(ulong)uVar8,
            (ulong)uVar7);
  }
  if (local_1288 != 0) {
    fprintf(_stderr,"%s: WARNING %d of %d processed file(s) failed GOST hash sum check\n",*argv,
            (ulong)local_1288,(ulong)(uVar7 - uVar8));
  }
  local_1288 = local_1288 | uVar8;
LAB_001016eb:
  exit((uint)(local_1288 != 0));
}

Assistant:

int main(int argc, char **argv)
{
    int c, i;
    int verbose = 0;
    int errors = 0;
    int open_mode = O_RDONLY | O_BINARY;
    FILE *check_file = NULL;
    int filenames_from_stdin = 0;
    int hashsize = 32;
    gost_hash_ctx ctx;

    while ((c = getopt(argc, argv, "hxlvc::")) != -1) {
        switch (c) {
        case 'h':
            help();
            exit(0);
            break;
        case 'v':
            verbose = 1;
            break;
        case 'l':
            hashsize = 64;
            break;
        case 'x':
            filenames_from_stdin = 1;
            break;
        case 'c':
            if (optarg) {
                check_file = fopen(optarg, "r");
                if (!check_file) {
                    perror(optarg);
                    exit(2);
                }
            } else {
                check_file = stdin;
            }
            break;
        default:
            fprintf(stderr, "invalid option %c\n", optopt);
            help();
        }
    }

    if (check_file) {
        char inhash[MAX_HASH_TXT_BYTES + 1], calcsum[MAX_HASH_TXT_BYTES + 1],
            filename[PATH_MAX];
        int failcount = 0, count = 0;
        int expected_hash_size = 0;
        if (check_file == stdin && optind < argc) {
            check_file = fopen(argv[optind], "r");
            if (!check_file) {
                perror(argv[optind]);
                exit(2);
            }
        }
        while (get_line
               (check_file, inhash, filename, verbose, &expected_hash_size)) {
            int error = 0;
            if (expected_hash_size == 0) {
                fprintf(stderr, "%s: invalid hash length\n", filename);
                errors++;
                count++;
                continue;
            }

            if (!hash_file
                (&ctx, filename, calcsum, open_mode, expected_hash_size)) {
                errors++;
                error = 1;
            }
            count++;
            if (error)
                continue;

            if (!strncmp(calcsum, inhash, expected_hash_size * 2 + 1)) {
                if (verbose) {
                    fprintf(stderr, "%s\tOK\n", filename);
                }
            } else {
                if (verbose) {
                    fprintf(stderr, "%s\tFAILED\n", filename);
                } else {
                    fprintf(stderr, "%s: GOST hash sum check failed\n",
                            filename);
                }
                failcount++;
            }
        }
        if (errors) {
            fprintf(stderr,
                    "%s: WARNING %d of %d file(s) cannot be processed\n",
                    argv[0], errors, count);

        }
        if (failcount) {
            fprintf(stderr,
                    "%s: WARNING %d of %d processed file(s) failed GOST hash sum check\n",
                    argv[0], failcount, count - errors);
        }
        exit((failcount || errors) ? 1 : 0);
    } else if (filenames_from_stdin) {
        char sum[MAX_HASH_TXT_BYTES + 1];
        char filename[PATH_MAX + 1], *end;
        while (!feof(stdin)) {
            if (!fgets(filename, PATH_MAX, stdin))
                break;
            for (end = filename; *end; end++) ;
            end--;
            for (; *end == '\n' || *end == '\r'; end--)
                *end = 0;
            if (!hash_file(&ctx, filename, sum, open_mode, hashsize)) {
                errors++;
            } else {
                printf("%s %s\n", sum, filename);
            }
        }

    } else if (optind == argc) {
        char sum[MAX_HASH_TXT_BYTES + 1];
        if (!hash_stream(&ctx, fileno(stdin), sum, hashsize)) {
            perror("stdin");
            exit(1);
        }
        printf("%s -\n", sum);
        exit(0);
    } else {
        for (i = optind; i < argc; i++) {
            char sum[MAX_HASH_TXT_BYTES + 1];
            if (!hash_file(&ctx, argv[i], sum, open_mode, hashsize)) {
                errors++;
            } else {
                printf("%s %s\n", sum, argv[i]);
            }
        }
    }
    exit(errors ? 1 : 0);
}